

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

void __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Union(MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  size_t *psVar1;
  _List_node_base **pp_Var2;
  _List_node_base *p_Var3;
  _List_iterator<GF2::MM<135UL>_> _Var4;
  long lVar5;
  _List_node_base *p_Var6;
  
  _Var4 = std::
          __lower_bound<std::_List_iterator<GF2::MM<135ul>>,GF2::MM<135ul>,__gnu_cxx::__ops::_Iter_comp_val<GF2::MOLex<135ul>>>
                    ((this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
                     super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl.
                     _M_node.super__List_node_base._M_next,this,mRight);
  if (_Var4._M_node != (_List_node_base *)this) {
    lVar5 = 0;
    do {
      pp_Var2 = &_Var4._M_node[2]._M_next + lVar5;
      p_Var3 = (_List_node_base *)(mRight->super_WW<135UL>)._words[lVar5 + 2];
      if (lVar5 == -2) break;
      lVar5 = lVar5 + -1;
    } while (*pp_Var2 == p_Var3);
    if (*pp_Var2 == p_Var3) {
      return;
    }
  }
  p_Var6 = (_List_node_base *)operator_new(0x28);
  p_Var3 = (_List_node_base *)(mRight->super_WW<135UL>)._words[1];
  p_Var6[1]._M_next = (_List_node_base *)(mRight->super_WW<135UL>)._words[0];
  p_Var6[1]._M_prev = p_Var3;
  p_Var6[2]._M_next = (_List_node_base *)(mRight->super_WW<135UL>)._words[2];
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
            super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Union(const MM<_n>& mRight)
	{	
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет mRight?
		if (iter == end() || *iter != mRight)
			insert(iter, mRight);
	}